

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardOptions.hpp
# Opt level: O2

void __thiscall
Configurable::DisplayOption<AmstradCPC::Machine::Options>::declare_display_option
          (DisplayOption<AmstradCPC::Machine::Options> *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"output",&local_31);
  Reflection::StructImpl<AmstradCPC::Machine::Options>::declare<Configurable::Display>
            ((StructImpl<AmstradCPC::Machine::Options> *)(this + -2),&this->output,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Reflection::Enum::declare<Configurable::Display>
            ("Display","RGB, SVideo, CompositeColour, CompositeMonochrome");
  return;
}

Assistant:

void declare_display_option() {
			static_cast<Owner *>(this)->declare(&output, "output");
			AnnounceEnumNS(Configurable, Display);
		}